

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::do_report_error(format_func func,int error_code,char *message)

{
  char *__ptr;
  size_t __size;
  size_t sVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  code *in_RDI;
  memory_buffer full_message;
  allocator<char> *in_stack_fffffffffffffda8;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffdb0;
  buffer<char> *this;
  buffer<char> local_230 [16];
  undefined8 local_18;
  undefined4 local_c;
  code *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  (*local_8)(local_230,local_c,local_18);
  this = local_230;
  __ptr = buffer<char>::data(this);
  __size = buffer<char>::size(this);
  sVar1 = fwrite(__ptr,__size,1,_stderr);
  if (sVar1 != 0) {
    fputc(10,_stderr);
  }
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x69aecd);
  return;
}

Assistant:

FMT_FUNC void do_report_error(format_func func, int error_code,
                              const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_all because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}